

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

bool __thiscall
glcts::ProgramUniformCase::setAndCompareMatrixUniforms
          (ProgramUniformCase *this,GLuint pipeline,GLuint programA,GLuint programB,DataType dType,
          int seed)

{
  size_type *this_00;
  float fVar1;
  uint uVar2;
  TestLog *pTVar3;
  GLuint GVar4;
  GLuint GVar5;
  int iVar6;
  GLint GVar7;
  undefined4 extraout_var;
  GLint *pGVar8;
  TestError *pTVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  float *pfVar14;
  GLint *pGVar15;
  byte bVar16;
  undefined8 *puVar17;
  float fVar18;
  uint local_554;
  GLuint local_550;
  uint local_54c;
  byte local_545;
  int local_544;
  GLuint local_540;
  int local_53c;
  long local_538;
  GLuint local_530;
  int local_52c;
  GLint locationB [12];
  GLint locationA [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  string local_4a8;
  string local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  GLuint activeProgram;
  string uniformBaseName;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  string local_3b8;
  string local_398;
  float data [104];
  string local_1d8;
  string name;
  
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_550 = programB;
  local_52c = seed;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_538 = CONCAT44(extraout_var,iVar6);
  uStack_3d0 = 0;
  local_3c8 = 0;
  uStack_3c0 = 0;
  local_3e8 = 0x400000004;
  uStack_3e0 = 0x900000009;
  local_3d8 = 0x1000000010;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&uniformBaseName,"uValM",(allocator<char> *)&name);
  this_00 = &name._M_string_length;
  name._M_dataplus._M_p = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  local_530 = pipeline;
  std::operator<<((ostream *)this_00,"Begin:ProgramUniformCase for Matrix iterate");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&name,(EndMessageToken *)&tcu::TestLog::EndMessage);
  bVar16 = dType < TYPE_DOUBLE & (byte)(0x2220 >> ((byte)dType & 0x1f));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  local_544 = 0;
  local_545 = bVar16 ^ 1;
  local_540 = programA;
  for (local_554 = 2; lVar13 = local_538, (int)local_554 < 5; local_554 = local_554 + 1) {
    for (local_54c = 2; (int)local_54c < 5; local_54c = local_54c + 1) {
      for (local_53c = 0; iVar6 = local_544, local_53c < 2; local_53c = local_53c + 1) {
        lVar13 = (long)local_544;
        if (local_554 == local_54c && local_545 == 0) {
          de::toString<int>(&local_4a8,(int *)&local_554);
          std::operator+(&local_468,&uniformBaseName,&local_4a8);
          std::operator+(&local_4c8,&local_468,"[");
          de::toString<int>(&local_488,&local_53c);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &activeProgram,&local_4c8,&local_488);
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &activeProgram,"]");
          std::__cxx11::string::~string((string *)&activeProgram);
          std::__cxx11::string::~string((string *)&local_488);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::__cxx11::string::~string((string *)&local_468);
          std::__cxx11::string::~string((string *)&local_4a8);
          lVar10 = local_538;
          GVar7 = (**(code **)(local_538 + 0xb48))(programA,name._M_dataplus._M_p);
          locationA[lVar13] = GVar7;
          GVar7 = (**(code **)(lVar10 + 0xb48))(local_550,name._M_dataplus._M_p);
LAB_00bff3b9:
          locationB[lVar13] = GVar7;
          std::__cxx11::string::~string((string *)&name);
          programA = local_540;
          local_544 = iVar6 + 1;
        }
        else if (local_554 != local_54c && bVar16 == 0) {
          de::toString<int>(&local_1d8,(int *)&local_554);
          std::operator+(&local_488,&uniformBaseName,&local_1d8);
          std::operator+(&local_4a8,&local_488,"x");
          de::toString<int>(&local_398,(int *)&local_54c);
          std::operator+(&local_468,&local_4a8,&local_398);
          std::operator+(&local_4c8,&local_468,"[");
          de::toString<int>(&local_3b8,&local_53c);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &activeProgram,&local_4c8,&local_3b8);
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &activeProgram,"]");
          std::__cxx11::string::~string((string *)&activeProgram);
          std::__cxx11::string::~string((string *)&local_3b8);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::__cxx11::string::~string((string *)&local_468);
          std::__cxx11::string::~string((string *)&local_398);
          std::__cxx11::string::~string((string *)&local_4a8);
          std::__cxx11::string::~string((string *)&local_488);
          std::__cxx11::string::~string((string *)&local_1d8);
          lVar10 = local_538;
          GVar7 = (**(code **)(local_538 + 0xb48))(programA,name._M_dataplus._M_p);
          locationA[lVar13] = GVar7;
          GVar7 = (**(code **)(lVar10 + 0xb48))(local_550,name._M_dataplus._M_p);
          goto LAB_00bff3b9;
        }
      }
    }
  }
  for (lVar10 = 0; lVar10 != 0x68; lVar10 = lVar10 + 1) {
    data[lVar10] = (float)(local_52c + (int)lVar10);
  }
  local_554 = 0x68;
  if (bVar16 == 0) {
    (**(code **)(local_538 + 0x1178))(programA,locationA[0],2,0,data);
    (**(code **)(lVar13 + 0x1188))(programA,locationA[2],2,0,data + 0xc);
    (**(code **)(lVar13 + 0x11a8))(programA,locationA[4],2,0,data + 0x1c);
    (**(code **)(lVar13 + 0x11b8))(programA,locationA[6],2,0,data + 0x28);
    (**(code **)(lVar13 + 0x11d8))(programA,locationA[8],2,0,data + 0x40);
    (**(code **)(lVar13 + 0x11e8))(programA,locationA[10],2,0,data + 0x50);
    puVar17 = (undefined8 *)&DAT_017411c0;
  }
  else {
    (**(code **)(local_538 + 0x1168))(programA,locationA[0],2,0,data);
    (**(code **)(lVar13 + 0x1198))(programA,locationA[2],2,0,data + 8);
    (**(code **)(lVar13 + 0x11c8))(programA,locationA[4],2,0,data + 0x1a);
    puVar17 = &local_3e8;
  }
  pfVar14 = data;
  local_554 = 0;
  do {
    if (local_544 <= (int)local_554) {
      data[0] = data[0x67];
      fVar18 = data[0x67];
      for (lVar10 = 1; lVar10 != 0x68; lVar10 = lVar10 + 1) {
        fVar18 = fVar18 + 1.0;
        data[lVar10] = fVar18;
      }
      local_554 = 0x68;
      if (bVar16 == 0) {
        (**(code **)(lVar13 + 0x1178))(local_550,locationB[0],2,0,data);
        (**(code **)(lVar13 + 0x1188))(local_550,locationB[2],2,0,data + 0xc);
        (**(code **)(lVar13 + 0x11a8))(local_550,locationB[4],2,0,data + 0x1c);
        (**(code **)(lVar13 + 0x11b8))(local_550,locationB[6],2,0,data + 0x28);
        (**(code **)(lVar13 + 0x11d8))(local_550,locationB[8],2,0,data + 0x40);
        (**(code **)(lVar13 + 0x11e8))(local_550,locationB[10],2,0,data + 0x50);
        puVar17 = (undefined8 *)&DAT_017411c0;
      }
      else {
        (**(code **)(lVar13 + 0x1168))(local_550,locationB[0],2,0,data);
        (**(code **)(lVar13 + 0x1198))(local_550,locationB[2],2,0,data + 8);
        (**(code **)(lVar13 + 0x11c8))(local_550,locationB[4],2,0,data + 0x1a);
        puVar17 = &local_3e8;
      }
      pfVar14 = data;
      local_554 = 0;
      do {
        GVar4 = local_540;
        if (local_544 <= (int)local_554) {
          activeProgram = 0;
          if (local_530 != 0) {
            (**(code **)(lVar13 + 0x9a0))(local_530,0x8259,&activeProgram);
            GVar5 = activeProgram;
            if ((activeProgram != 0) && (activeProgram == GVar4 || activeProgram == local_550)) {
              data[0] = data[0x67];
              fVar18 = data[0x67];
              for (lVar10 = 1; lVar10 != 0x68; lVar10 = lVar10 + 1) {
                fVar18 = fVar18 + 1.0;
                data[lVar10] = fVar18;
              }
              pGVar15 = locationB;
              if (activeProgram == GVar4) {
                pGVar15 = locationA;
              }
              local_554 = 0x68;
              if (bVar16 == 0) {
                (**(code **)(lVar13 + 0x15f0))(*pGVar15,2,0,data);
                pGVar8 = locationB;
                if (GVar5 == GVar4) {
                  pGVar8 = locationA;
                }
                (**(code **)(lVar13 + 0x1600))(pGVar8[2],2,0,data + 0xc);
                pGVar8 = locationB;
                if (GVar5 == GVar4) {
                  pGVar8 = locationA;
                }
                (**(code **)(lVar13 + 0x1620))(pGVar8[4],2,0,data + 0x1c);
                pGVar8 = locationB;
                if (GVar5 == GVar4) {
                  pGVar8 = locationA;
                }
                (**(code **)(lVar13 + 0x1630))(pGVar8[6],2,0,data + 0x28);
                pGVar8 = locationB;
                if (GVar5 == GVar4) {
                  pGVar8 = locationA;
                }
                (**(code **)(lVar13 + 0x1650))(pGVar8[8],2,0,data + 0x40);
                pGVar8 = locationB;
                if (GVar5 == GVar4) {
                  pGVar8 = locationA;
                }
                (**(code **)(lVar13 + 0x1660))(pGVar8[10],2,0,data + 0x50);
                puVar17 = (undefined8 *)&DAT_017411c0;
              }
              else {
                (**(code **)(lVar13 + 0x15e0))(*pGVar15,2,0,data);
                pGVar8 = locationB;
                if (GVar5 == GVar4) {
                  pGVar8 = locationA;
                }
                (**(code **)(lVar13 + 0x1610))(pGVar8[2],2,0,data + 8);
                pGVar8 = locationB;
                if (GVar5 == GVar4) {
                  pGVar8 = locationA;
                }
                (**(code **)(lVar13 + 0x1640))(pGVar8[4],2,0,data + 0x1a);
                puVar17 = &local_3e8;
              }
              pfVar14 = data;
              for (local_554 = 0; (int)local_554 < local_544; local_554 = local_554 + 1) {
                (**(code **)(lVar13 + 0xb60))(activeProgram,pGVar15[(int)local_554],&name);
                local_54c = *(uint *)((long)puVar17 + (long)(int)local_554 * 4);
                if ((int)local_54c < 1) {
                  local_54c = 0;
                }
                for (uVar12 = 0; local_54c != uVar12; uVar12 = uVar12 + 1) {
                  fVar18 = *(float *)((long)&name._M_dataplus._M_p + uVar12 * 4);
                  if ((fVar18 != *pfVar14) || (NAN(fVar18) || NAN(*pfVar14))) {
                    local_54c = (uint)uVar12;
                    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
                    tcu::TestError::TestError
                              (pTVar9,"ActiveShaderProgram with glUniform failed",(char *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                               ,0x74e);
                    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                  }
                  pfVar14 = pfVar14 + 1;
                }
              }
            }
          }
          std::__cxx11::string::~string((string *)&uniformBaseName);
          return true;
        }
        (**(code **)(lVar13 + 0xb60))(local_540,locationA[(int)local_554],&name);
        (**(code **)(lVar13 + 0xb60))(local_550,locationB[(int)local_554],&activeProgram);
        uVar2 = *(uint *)((long)puVar17 + (long)(int)local_554 * 4);
        uVar12 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar12 = 0;
        }
        for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
          fVar18 = (float)(&activeProgram)[uVar11];
          if ((fVar18 != *pfVar14) || (NAN(fVar18) || NAN(*pfVar14))) {
LAB_00bffa5a:
            local_54c = (uint)uVar11;
            pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar9,"ProgramUniformi failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0x70e);
            __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          fVar1 = *(float *)((long)&name._M_dataplus._M_p + uVar11 * 4);
          if ((fVar1 == fVar18) && (!NAN(fVar1) && !NAN(fVar18))) goto LAB_00bffa5a;
          pfVar14 = pfVar14 + 1;
        }
        local_54c = (uint)uVar12;
        local_554 = local_554 + 1;
      } while( true );
    }
    (**(code **)(lVar13 + 0xb60))(local_540,locationA[(int)local_554],&name);
    (**(code **)(lVar13 + 0xb60))(local_550,locationB[(int)local_554],&activeProgram);
    uVar2 = *(uint *)((long)puVar17 + (long)(int)local_554 * 4);
    uVar12 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar12 = 0;
    }
    for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      fVar18 = *(float *)((long)&name._M_dataplus._M_p + uVar11 * 4);
      if ((fVar18 != *pfVar14) || (NAN(fVar18) || NAN(*pfVar14))) {
LAB_00bffa12:
        local_54c = (uint)uVar11;
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,"ProgramUniformi failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x6d8);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if ((fVar18 == (float)(&activeProgram)[uVar11]) &&
         (!NAN(fVar18) && !NAN((float)(&activeProgram)[uVar11]))) goto LAB_00bffa12;
      pfVar14 = pfVar14 + 1;
    }
    local_54c = (uint)uVar12;
    local_554 = local_554 + 1;
  } while( true );
}

Assistant:

bool setAndCompareMatrixUniforms(glw::GLuint pipeline, glw::GLuint programA, glw::GLuint programB,
									 glu::DataType dType, int seed)
	{
		TestLog&			  log		  = m_testCtx.getLog();
		const glw::Functions& gl		  = m_context.getRenderContext().getFunctions();
		bool				  isSquareMat = isDataTypeSquareMatrix(dType);
		// The matrix versions of the fragment shader have two element arrays
		// of each uniform.
		// There are 3 * 2 uniforms for the square matrix shader and
		// 6 * 2 uniforms in the non-square matrix shader.
		const int  maxUniforms = 12;
		int		   numUniforms;
		const int  arraySize = 2;
		glw::GLint locationA[maxUniforms];
		glw::GLint locationB[maxUniforms];
		// These arrays represent the number of floats for each uniform location
		// 2x2[0], 2x2[1], 3x3[0], 3x3[1], 4x4[0], 4x4[1]
		const int floatCountSqu[maxUniforms] = { 4, 4, 9, 9, 16, 16, 0, 0, 0, 0, 0, 0 };
		// 2x3[0], 2x3[1], 2x4[0], 2x4[1], 3x2[0], 3x2[1], 3x4[0], 3x4[1], 4x2[0]...
		const int  floatCountNonSqu[maxUniforms] = { 6, 6, 8, 8, 6, 6, 12, 12, 8, 8, 12, 12 };
		const int* floatCount;
		// Max data for the uniforms = 2*(2*3 + 3*2 + 2*4 + 4*2 + 3*4 + 4*3)
		const int   maxDataCount = 104;
		float		data[maxDataCount];
		int			i, j, k;
		std::string uniformBaseName("uValM");

		// ProgramUniform API verification
		log << TestLog::Message << "Begin:ProgramUniformCase for Matrix iterate" << TestLog::EndMessage;

		numUniforms = 0;
		// get uniform locations
		for (i = 2; i <= 4; i++) // matrix dimension m
		{
			for (j = 2; j <= 4; j++) // matrix dimension n
			{
				for (k = 0; k < arraySize; k++)
				{
					if ((i == j) && isSquareMat)
					{
						string name			   = uniformBaseName + de::toString(i) + "[" + de::toString(k) + "]";
						locationA[numUniforms] = gl.getUniformLocation(programA, name.c_str());
						locationB[numUniforms] = gl.getUniformLocation(programB, name.c_str());
						numUniforms++;
					}
					else if ((i != j) && !isSquareMat)
					{
						string name =
							uniformBaseName + de::toString(i) + "x" + de::toString(j) + "[" + de::toString(k) + "]";
						locationA[numUniforms] = gl.getUniformLocation(programA, name.c_str());
						locationB[numUniforms] = gl.getUniformLocation(programB, name.c_str());
						numUniforms++;
					}
				}
			}
		}
		DE_ASSERT((numUniforms == 6) || (numUniforms == 12));

		// init the float data array
		for (i = 0; i < maxDataCount; i++)
		{
			data[i] = (float)(seed + i);
		}

		// Set the uniforms in programA
		float* value = &data[0];
		if (isSquareMat)
		{
			floatCount = floatCountSqu;
			gl.programUniformMatrix2fv(programA, locationA[0], arraySize, GL_FALSE, value);
			value += 2 * 2 * arraySize;
			gl.programUniformMatrix3fv(programA, locationA[2], arraySize, GL_FALSE, value);
			value += 3 * 3 * arraySize;
			gl.programUniformMatrix4fv(programA, locationA[4], arraySize, GL_FALSE, value);
		}
		else
		{
			floatCount = floatCountNonSqu;
			gl.programUniformMatrix2x3fv(programA, locationA[0], arraySize, GL_FALSE, value);
			value += 2 * 3 * arraySize;
			gl.programUniformMatrix2x4fv(programA, locationA[2], arraySize, GL_FALSE, value);
			value += 2 * 4 * arraySize;
			gl.programUniformMatrix3x2fv(programA, locationA[4], arraySize, GL_FALSE, value);
			value += 3 * 2 * arraySize;
			gl.programUniformMatrix3x4fv(programA, locationA[6], arraySize, GL_FALSE, value);
			value += 3 * 4 * arraySize;
			gl.programUniformMatrix4x2fv(programA, locationA[8], arraySize, GL_FALSE, value);
			value += 4 * 2 * arraySize;
			gl.programUniformMatrix4x3fv(programA, locationA[10], arraySize, GL_FALSE, value);
		}

		// get and compare the uniform data
		value = &data[0];
		for (i = 0; i < numUniforms; i++)
		{
			float retValA[16], retValB[16];

			gl.getUniformfv(programA, locationA[i], retValA);
			gl.getUniformfv(programB, locationB[i], retValB);

			for (j = 0; j < floatCount[i]; j++)
			{
				// Compare programA uniform to expected value and
				// test to see if programB picked up the value.
				if ((retValA[j] != *value++) || (retValA[j] == retValB[j]))
				{
					TCU_FAIL("ProgramUniformi failed");
				}
			}
		}

		// reseed the float buffer
		data[0] = data[maxDataCount - 1];
		for (i = 1; i < maxDataCount; i++)
		{
			data[i] = data[i - 1] + 1.0f;
		}

		// set uniforms in program B
		value = &data[0];
		if (isSquareMat)
		{
			floatCount = floatCountSqu;
			gl.programUniformMatrix2fv(programB, locationB[0], arraySize, GL_FALSE, value);
			value += 2 * 2 * arraySize;
			gl.programUniformMatrix3fv(programB, locationB[2], arraySize, GL_FALSE, value);
			value += 3 * 3 * arraySize;
			gl.programUniformMatrix4fv(programB, locationB[4], arraySize, GL_FALSE, value);
		}
		else
		{
			floatCount = floatCountNonSqu;
			gl.programUniformMatrix2x3fv(programB, locationB[0], arraySize, GL_FALSE, value);
			value += 2 * 3 * arraySize;
			gl.programUniformMatrix2x4fv(programB, locationB[2], arraySize, GL_FALSE, value);
			value += 2 * 4 * arraySize;
			gl.programUniformMatrix3x2fv(programB, locationB[4], arraySize, GL_FALSE, value);
			value += 3 * 2 * arraySize;
			gl.programUniformMatrix3x4fv(programB, locationB[6], arraySize, GL_FALSE, value);
			value += 3 * 4 * arraySize;
			gl.programUniformMatrix4x2fv(programB, locationB[8], arraySize, GL_FALSE, value);
			value += 4 * 2 * arraySize;
			gl.programUniformMatrix4x3fv(programB, locationB[10], arraySize, GL_FALSE, value);
		}

		// get and compare the uniform data
		value = &data[0];
		for (i = 0; i < numUniforms; i++)
		{
			float retValA[16], retValB[16];

			gl.getUniformfv(programA, locationA[i], retValA);
			gl.getUniformfv(programB, locationB[i], retValB);

			for (j = 0; j < floatCount[i]; j++)
			{
				// Compare programB uniform to expected value and
				// test to see if programA picked up the value.
				if ((retValB[j] != *value++) || (retValA[j] == retValB[j]))
				{
					TCU_FAIL("ProgramUniformi failed");
				}
			}
		}

		// Use the conventional uniform interfaces on an ACTIVE_PROGRAM
		glw::GLuint activeProgram = 0;
		if (pipeline != 0)
		{
			gl.getProgramPipelineiv(pipeline, GL_ACTIVE_PROGRAM, (int*)&activeProgram);
		}
		if ((activeProgram != 0) && ((activeProgram == programA) || (activeProgram == programB)))
		{
			glw::GLint* location;

			location = (activeProgram == programA) ? locationA : locationB;

			// reseed the float buffer
			data[0] = data[maxDataCount - 1];
			for (i = 1; i < maxDataCount; i++)
			{
				data[i] = data[i - 1] + 1.0f;
			}

			// set uniforms with conventional uniform calls
			value = &data[0];
			if (isSquareMat)
			{
				floatCount = floatCountSqu;
				gl.uniformMatrix2fv(location[0], arraySize, GL_FALSE, value);
				value += 2 * 2 * arraySize;
				gl.uniformMatrix3fv(location[2], arraySize, GL_FALSE, value);
				value += 3 * 3 * arraySize;
				gl.uniformMatrix4fv(location[4], arraySize, GL_FALSE, value);
			}
			else
			{
				floatCount = floatCountNonSqu;
				gl.uniformMatrix2x3fv(location[0], arraySize, GL_FALSE, value);
				value += 2 * 3 * arraySize;
				gl.uniformMatrix2x4fv(location[2], arraySize, GL_FALSE, value);
				value += 2 * 4 * arraySize;
				gl.uniformMatrix3x2fv(location[4], arraySize, GL_FALSE, value);
				value += 3 * 2 * arraySize;
				gl.uniformMatrix3x4fv(location[6], arraySize, GL_FALSE, value);
				value += 3 * 4 * arraySize;
				gl.uniformMatrix4x2fv(location[8], arraySize, GL_FALSE, value);
				value += 4 * 2 * arraySize;
				gl.uniformMatrix4x3fv(location[10], arraySize, GL_FALSE, value);
			}

			// get and compare the uniform data
			value = &data[0];
			for (i = 0; i < numUniforms; i++)
			{
				float retVal[16];

				gl.getUniformfv(activeProgram, location[i], retVal);

				for (j = 0; j < floatCount[i]; j++)
				{
					// Compare activeshaderprogram uniform to expected value
					if (retVal[j] != *value++)
					{
						TCU_FAIL("ActiveShaderProgram with glUniform failed");
					}
				}
			}
		}

		return true;
	}